

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O3

void __thiscall QWaitCondition::wakeAll(QWaitCondition *this)

{
  QWaitConditionPrivate *pQVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this->d);
  if (iVar2 != 0) {
    qErrnoWarning(iVar2,"%s: %s failure","QWaitCondition::wakeAll()","mutex lock");
  }
  pQVar1 = this->d;
  pQVar1->wakeups = pQVar1->waiters;
  iVar2 = pthread_cond_broadcast((pthread_cond_t *)&pQVar1->cond);
  if (iVar2 != 0) {
    qErrnoWarning(iVar2,"%s: %s failure","QWaitCondition::wakeAll()","cv broadcast");
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this->d);
  if (iVar2 == 0) {
    return;
  }
  qErrnoWarning(iVar2,"%s: %s failure","QWaitCondition::wakeAll()","mutex unlock");
  return;
}

Assistant:

void QWaitCondition::wakeAll()
{
    qt_report_pthread_error(pthread_mutex_lock(&d->mutex), "QWaitCondition::wakeAll()",
                            "mutex lock");
    d->wakeups = d->waiters;
    qt_report_pthread_error(pthread_cond_broadcast(&d->cond), "QWaitCondition::wakeAll()",
                            "cv broadcast");
    qt_report_pthread_error(pthread_mutex_unlock(&d->mutex), "QWaitCondition::wakeAll()",
                            "mutex unlock");
}